

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slufactor.h
# Opt level: O0

void __thiscall soplex::SLUFactor<double>::setMarkowitz(SLUFactor<double> *this,double m)

{
  double m_local;
  SLUFactor<double> *this_local;
  
  m_local = m;
  if (m < 0.0001) {
    m_local = 0.0001;
  }
  if (0.9999 < m_local) {
    m_local = 0.9999;
  }
  this->minThreshold = m_local;
  this->lastThreshold = m_local;
  return;
}

Assistant:

void setMarkowitz(R m)
   {
      if(m < 0.0001)
         m = 0.0001;

      if(m > 0.9999)
         m = 0.9999;

      minThreshold = m;
      lastThreshold = m;
   }